

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

ZSTD_compressionParameters *
duckdb_zstd::ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize,
          ZSTD_cParamMode_e mode,ZSTD_paramSwitch_e useRowMatchFinder)

{
  U32 UVar1;
  U32 UVar2;
  int iVar3;
  U32 in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  ZSTD_compressionParameters *in_RDI;
  U32 maxHashLog;
  U32 maxRowHashLog;
  U32 rowLog;
  U32 maxShortCacheHashLog;
  U32 cycleLog;
  U32 dictAndWindowLog;
  U32 srcLog;
  U32 tSize;
  U64 maxWindowResize;
  U64 minSrcSize;
  uint local_78;
  uint local_74;
  ZSTD_paramSwitch_e in_stack_ffffffffffffff90;
  uint uVar4;
  ZSTD_strategy in_stack_ffffffffffffff94;
  ZSTD_compressionParameters *dictSize_00;
  ZSTD_compressionParameters *cParams;
  ulong local_10;
  ulong local_8;
  
  cParams = (ZSTD_compressionParameters *)&stack0x00000008;
  local_10 = in_RDX;
  local_8 = in_RSI;
  switch(in_ECX) {
  case 0:
  case 3:
    break;
  case 1:
    local_10 = 0;
    break;
  case 2:
    if ((in_RDX != 0) && (in_RSI == 0xffffffffffffffff)) {
      local_8 = 0x201;
    }
  }
  dictSize_00 = in_RDI;
  UVar1 = in_ECX;
  if ((local_8 < 0x40000001) && (local_10 < 0x40000001)) {
    if ((uint)((int)local_8 + (int)local_10) < 0x40) {
      in_stack_ffffffffffffff94 = ZSTD_btlazy2;
    }
    else {
      uVar4 = ZSTD_highbit32(0);
      in_stack_ffffffffffffff94 = uVar4 + ZSTD_fast;
    }
    if (in_stack_ffffffffffffff94 < cParams->windowLog) {
      cParams->windowLog = in_stack_ffffffffffffff94;
    }
  }
  if (local_8 != 0xffffffffffffffff) {
    UVar1 = ZSTD_dictAndWindowLog(UVar1,(U64)cParams,(U64)dictSize_00);
    UVar2 = ZSTD_cycleLog(cParams->chainLog,cParams->strategy);
    if (UVar1 + 1 < cParams->hashLog) {
      cParams->hashLog = UVar1 + 1;
    }
    if (UVar1 < UVar2) {
      cParams->chainLog = cParams->chainLog - (UVar2 - UVar1);
    }
  }
  if (cParams->windowLog < 10) {
    cParams->windowLog = 10;
  }
  if ((in_ECX == 2) && (iVar3 = ZSTD_CDictIndicesAreTagged(cParams), iVar3 != 0)) {
    if (0x18 < cParams->hashLog) {
      cParams->hashLog = 0x18;
    }
    if (0x18 < cParams->chainLog) {
      cParams->chainLog = 0x18;
    }
  }
  iVar3 = ZSTD_rowMatchFinderUsed(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  if (iVar3 != 0) {
    if (cParams->searchLog < 6) {
      uVar4 = cParams->searchLog;
    }
    else {
      uVar4 = 6;
    }
    if (uVar4 < 4) {
      local_74 = 4;
    }
    else {
      if (cParams->searchLog < 6) {
        local_78 = cParams->searchLog;
      }
      else {
        local_78 = 6;
      }
      local_74 = local_78;
    }
    if (local_74 + 0x18 < cParams->hashLog) {
      cParams->hashLog = local_74 + 0x18;
    }
  }
  uVar4 = cParams->chainLog;
  in_RDI->windowLog = cParams->windowLog;
  in_RDI->chainLog = uVar4;
  uVar4 = cParams->searchLog;
  in_RDI->hashLog = cParams->hashLog;
  in_RDI->searchLog = uVar4;
  uVar4 = cParams->targetLength;
  in_RDI->minMatch = cParams->minMatch;
  in_RDI->targetLength = uVar4;
  in_RDI->strategy = cParams->strategy;
  return dictSize_00;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize,
                            ZSTD_cParamMode_e mode,
                            ZSTD_paramSwitch_e useRowMatchFinder)
{
    const U64 minSrcSize = 513; /* (1<<9) + 1 */
    const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    /* Cascade the selected strategy down to the next-highest one built into
     * this binary. */
#ifdef ZSTD_EXCLUDE_BTULTRA_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_btultra2) {
        cPar.strategy = ZSTD_btultra;
    }
    if (cPar.strategy == ZSTD_btultra) {
        cPar.strategy = ZSTD_btopt;
    }
#endif
#ifdef ZSTD_EXCLUDE_BTOPT_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_btopt) {
        cPar.strategy = ZSTD_btlazy2;
    }
#endif
#ifdef ZSTD_EXCLUDE_BTLAZY2_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_btlazy2) {
        cPar.strategy = ZSTD_lazy2;
    }
#endif
#ifdef ZSTD_EXCLUDE_LAZY2_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_lazy2) {
        cPar.strategy = ZSTD_lazy;
    }
#endif
#ifdef ZSTD_EXCLUDE_LAZY_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_lazy) {
        cPar.strategy = ZSTD_greedy;
    }
#endif
#ifdef ZSTD_EXCLUDE_GREEDY_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_greedy) {
        cPar.strategy = ZSTD_dfast;
    }
#endif
#ifdef ZSTD_EXCLUDE_DFAST_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_dfast) {
        cPar.strategy = ZSTD_fast;
        cPar.targetLength = 0;
    }
#endif

    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
        /* If we don't know the source size, don't make any
         * assumptions about it. We will already have selected
         * smaller parameters if a dictionary is in use.
         */
        break;
    case ZSTD_cpm_createCDict:
        /* Assume a small source size when creating a dictionary
         * with an unknown source size.
         */
        if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            srcSize = minSrcSize;
        break;
    case ZSTD_cpm_attachDict:
        /* Dictionary has its own dedicated parameters which have
         * already been selected. We are selecting parameters
         * for only the source.
         */
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize <= maxWindowResize)
      && (dictSize <= maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (srcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const dictAndWindowLog = ZSTD_dictAndWindowLog(cPar.windowLog, (U64)srcSize, (U64)dictSize);
        U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cPar.hashLog > dictAndWindowLog+1) cPar.hashLog = dictAndWindowLog+1;
        if (cycleLog > dictAndWindowLog)
            cPar.chainLog -= (cycleLog - dictAndWindowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    /* We can't use more than 32 bits of hash in total, so that means that we require:
     * (hashLog + 8) <= 32 && (chainLog + 8) <= 32
     */
    if (mode == ZSTD_cpm_createCDict && ZSTD_CDictIndicesAreTagged(&cPar)) {
        U32 const maxShortCacheHashLog = 32 - ZSTD_SHORT_CACHE_TAG_BITS;
        if (cPar.hashLog > maxShortCacheHashLog) {
            cPar.hashLog = maxShortCacheHashLog;
        }
        if (cPar.chainLog > maxShortCacheHashLog) {
            cPar.chainLog = maxShortCacheHashLog;
        }
    }


    /* At this point, we aren't 100% sure if we are using the row match finder.
     * Unless it is explicitly disabled, conservatively assume that it is enabled.
     * In this case it will only be disabled for small sources, so shrinking the
     * hash log a little bit shouldn't result in any ratio loss.
     */
    if (useRowMatchFinder == ZSTD_ps_auto)
        useRowMatchFinder = ZSTD_ps_enable;

    /* We can't hash more than 32-bits in total. So that means that we require:
     * (hashLog - rowLog + 8) <= 32
     */
    if (ZSTD_rowMatchFinderUsed(cPar.strategy, useRowMatchFinder)) {
        /* Switch to 32-entry rows if searchLog is 5 (or more) */
        U32 const rowLog = BOUNDED(4, cPar.searchLog, 6);
        U32 const maxRowHashLog = 32 - ZSTD_ROW_HASH_TAG_BITS;
        U32 const maxHashLog = maxRowHashLog + rowLog;
        assert(cPar.hashLog >= rowLog);
        if (cPar.hashLog > maxHashLog) {
            cPar.hashLog = maxHashLog;
        }
    }

    return cPar;
}